

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

void __thiscall
testing::TestPartResult::TestPartResult
          (TestPartResult *this,Type a_type,char *a_file_name,int a_line_number,char *a_message)

{
  char *message;
  char *pcVar1;
  allocator local_2a;
  allocator local_29;
  
  this->type_ = a_type;
  pcVar1 = "";
  if (a_file_name != (char *)0x0) {
    pcVar1 = a_file_name;
  }
  std::__cxx11::string::string((string *)&this->file_name_,pcVar1,&local_29);
  this->line_number_ = a_line_number;
  ExtractSummary_abi_cxx11_(&this->summary_,(TestPartResult *)a_message,message);
  std::__cxx11::string::string((string *)&this->message_,a_message,&local_2a);
  return;
}

Assistant:

TestPartResult(Type a_type,
                 const char* a_file_name,
                 int a_line_number,
                 const char* a_message)
      : type_(a_type),
        file_name_(a_file_name == NULL ? "" : a_file_name),
        line_number_(a_line_number),
        summary_(ExtractSummary(a_message)),
        message_(a_message) {
  }